

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c
# Opt level: O0

void plan(void)

{
  int iVar1;
  greatest_test_res local_c;
  greatest_test_res res;
  
  iVar1 = greatest_pre_test("roundtrip_plan_shoud_match");
  if (iVar1 == 1) {
    local_c = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (local_c == GREATEST_TEST_RES_PASS) {
      local_c = roundtrip_plan_shoud_match();
    }
    greatest_post_test("roundtrip_plan_shoud_match",local_c);
  }
  else if ((greatest_info.flags & 2) != 0) {
    fprintf(_stdout,"  %s\n","roundtrip_plan_shoud_match");
  }
  return;
}

Assistant:

SUITE(plan) {
    RUN_TEST(roundtrip_plan_shoud_match);
}